

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::verifySampleBuffers
          (SamplePosDistributionCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  ostringstream *poVar1;
  int width;
  int height;
  int iVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  TestLog *pTVar6;
  QualityWarning *this_00;
  int iVar7;
  size_type *psVar8;
  ConstPixelBufferAccess *pCVar9;
  pointer pSVar10;
  void *__buf;
  pointer pSVar11;
  void *__buf_00;
  ArrayBuffer<unsigned_int,_4UL,_4UL> *pAVar12;
  void *__buf_01;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  void *pvVar20;
  long lVar21;
  byte bVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePositions;
  Surface errorMask;
  string local_370;
  Surface local_350;
  string local_338;
  SampleAverageVerifier local_318;
  LogImageSet local_300;
  string local_2c0;
  TextureFormat local_2a0;
  string local_298;
  long local_278;
  ConstPixelBufferAccess local_270;
  LogImage local_248;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  pSVar10 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl
            .super__Vector_impl_data._M_start;
  width = pSVar10->m_width;
  height = pSVar10->m_height;
  pTVar6 = ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248.m_name._M_dataplus._M_p = (pointer)&local_248.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"SampleBuffers","");
  local_300.m_name._M_dataplus._M_p = (pointer)&local_300.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Image sample buffers","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)local_1b0,&local_248.m_name,&local_300.m_name);
  tcu::TestLog::startImageSet(pTVar6,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300.m_name._M_dataplus._M_p != &local_300.m_name.field_2) {
    operator_delete(local_300.m_name._M_dataplus._M_p,
                    local_300.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
    operator_delete(local_248.m_name._M_dataplus._M_p,
                    local_248.m_name.field_2._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(resultBuffers->
                              super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(resultBuffers->
                             super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    lVar25 = 0x10;
    lVar14 = 0;
    do {
      pTVar6 = ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
                super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((ostringstream *)local_1b0,(int)lVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,0x1cbd904);
      local_300.m_name._M_dataplus._M_p = (pointer)&local_300.m_name.field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_300.m_name.field_2._M_allocated_capacity = *psVar8;
        local_300.m_name.field_2._8_8_ = plVar5[3];
      }
      else {
        local_300.m_name.field_2._M_allocated_capacity = *psVar8;
        local_300.m_name._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_300.m_name._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((ostringstream *)local_1b0,(int)lVar14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x1c4e3c2);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_370.field_2._M_allocated_capacity = *psVar8;
        local_370.field_2._8_8_ = plVar5[3];
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar8;
        local_370._M_dataplus._M_p = (pointer)*plVar5;
      }
      pCVar9 = (ConstPixelBufferAccess *)local_1b0;
      local_370._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pSVar10 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_2c0._M_dataplus._M_p = (pointer)0x300000008;
      pvVar20 = *(void **)((long)&pSVar10->m_width + lVar25);
      if (pvVar20 != (void *)0x0) {
        pvVar20 = *(void **)((long)pSVar10 + lVar25 + -8);
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (pCVar9,(TextureFormat *)&local_2c0,*(int *)((long)pSVar10 + lVar25 + -0x10),
                 *(int *)((long)pSVar10 + lVar25 + -0xc),1,pvVar20);
      tcu::LogImage::LogImage
                (&local_248,&local_300.m_name,&local_370,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_248,(int)pTVar6,__buf,(size_t)pCVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
        operator_delete(local_248.m_description._M_dataplus._M_p,
                        local_248.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
        operator_delete(local_248.m_name._M_dataplus._M_p,
                        local_248.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.m_name._M_dataplus._M_p != &local_300.m_name.field_2) {
        operator_delete(local_300.m_name._M_dataplus._M_p,
                        local_300.m_name.field_2._M_allocated_capacity + 1);
      }
      if (local_270.m_format != (TextureFormat)(local_270.m_size.m_data + 2)) {
        operator_delete((void *)local_270.m_format,local_270._16_8_ + 1);
      }
      lVar14 = lVar14 + 1;
      lVar25 = lVar25 + 0x18;
    } while (lVar14 < (int)((ulong)((long)(resultBuffers->
                                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(resultBuffers->
                                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
  }
  tcu::TestLog::endImageSet
            (((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_1b0._0_8_ =
       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying sample position range",0x1f);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if ((int)((ulong)((long)(resultBuffers->
                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(resultBuffers->
                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3) * -0x55555555 < 1) {
    bVar3 = true;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar22 = 1;
    lVar25 = 0;
    lVar14 = 0;
    do {
      local_1b0._0_8_ =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verifying sample ",0x11)
      ;
      lVar14 = lVar14 + 1;
      std::ostream::operator<<(poVar1,(int)lVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/",1);
      std::ostream::operator<<
                (poVar1,(int)((ulong)((long)(resultBuffers->
                                            super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(resultBuffers->
                                           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x55555555);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = &PTR_verify_021612b0;
      bVar3 = verifyImageWithVerifier
                        ((Surface *)
                         ((long)&((resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->m_width + lVar25),
                         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log,
                         (Verifier *)local_1b0,false);
      bVar22 = bVar22 & bVar3;
      lVar25 = lVar25 + 0x18;
    } while (lVar14 < (int)((ulong)((long)(resultBuffers->
                                          super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(resultBuffers->
                                         super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555);
    bVar3 = true;
    if (bVar22 == 0) {
      local_1b0._0_8_ =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Sample position verification failed.",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar3 = false;
    }
  }
  tcu::Surface::Surface((Surface *)&local_318,width,height);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&local_350,
             ((long)(resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_1b0);
  local_248.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar20 = (void *)CONCAT44(local_318._20_4_,local_318.m_distanceThreshold);
  if (pvVar20 != (void *)0x0) {
    pvVar20 = (void *)CONCAT44(local_318._12_4_,local_318.m_numSamples);
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_248,
             (int)local_318.super_Verifier._vptr_Verifier,
             local_318.super_Verifier._vptr_Verifier._4_4_,1,pvVar20);
  local_248.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_248.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_248);
  local_1b0._0_8_ =
       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying sample position uniqueness.",0x25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (0 < height) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar4 = true;
    iVar24 = 0;
    iVar23 = 0;
    do {
      if (0 < width) {
        pSVar10 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar11 = (resultBuffers->super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        iVar13 = 0;
        do {
          if (0 < (int)((ulong)((long)pSVar11 - (long)pSVar10) >> 3) * -0x55555555) {
            lVar14 = 1;
            lVar25 = 0;
            do {
              uVar16 = *(uint *)(*(long *)(&pSVar10->m_width + lVar14 * 2) +
                                (long)(*(int *)((long)pSVar10 + lVar14 * 8 + -8) * iVar23 + iVar13)
                                * 4);
              *(float *)(CONCAT44(local_350.m_height,local_350.m_width) + lVar25 * 8) =
                   (float)(uVar16 >> 8 & 0xff) / 255.0;
              *(float *)(CONCAT44(local_350.m_height,local_350.m_width) + 4 + lVar25 * 8) =
                   (float)(uVar16 >> 0x10 & 0xff) / 255.0;
              lVar25 = lVar25 + 1;
              pSVar10 = (resultBuffers->
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pSVar11 = (resultBuffers->
                        super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
              iVar18 = (int)((long)pSVar11 - (long)pSVar10 >> 3) * -0x55555555;
              lVar14 = lVar14 + 3;
            } while (lVar25 < iVar18);
            if (0 < iVar18) {
              local_278 = 1;
              bVar22 = 0;
              lVar14 = 0;
              do {
                lVar25 = lVar14 + 1;
                bVar19 = (bool)(4 < iVar24 & bVar22);
                lVar26 = local_278;
                if (lVar25 < (int)((ulong)((long)pSVar11 - (long)pSVar10) >> 3) * -0x55555555) {
                  do {
                    if (bVar19) break;
                    bVar19 = true;
                    lVar21 = 0;
                    while( true ) {
                      fVar27 = *(float *)(CONCAT44(local_350.m_height,local_350.m_width) +
                                          lVar14 * 8 + lVar21 * 4);
                      fVar29 = *(float *)(CONCAT44(local_350.m_height,local_350.m_width) +
                                          lVar26 * 8 + lVar21 * 4);
                      if (!bVar19) break;
                      lVar21 = 1;
                      bVar19 = false;
                      if ((fVar27 != fVar29) || (NAN(fVar27) || NAN(fVar29))) break;
                    }
                    if ((fVar27 == fVar29) && (!NAN(fVar27) && !NAN(fVar29))) {
                      iVar24 = iVar24 + 1;
                      if (iVar24 < 6) {
                        local_1b0._0_8_ =
                             ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                              super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
                        std::__cxx11::ostringstream::ostringstream(poVar1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"Pixel (",7);
                        std::ostream::operator<<(poVar1,iVar13);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2)
                        ;
                        std::ostream::operator<<(poVar1,iVar23);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"): Samples ",0xb);
                        std::ostream::operator<<(poVar1,(int)lVar14);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1," and ",5);
                        std::ostream::operator<<(poVar1,(int)lVar26);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1," have the same position.",0x18);
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream(poVar1);
                        std::ios_base::~ios_base(local_138);
                        pSVar10 = (resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_start;
                        pSVar11 = (resultBuffers->
                                  super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                  _M_impl.super__Vector_impl_data._M_finish;
                      }
                      *(undefined4 *)
                       (CONCAT44(local_318._12_4_,local_318.m_numSamples) +
                       (long)((int)local_318.super_Verifier._vptr_Verifier * iVar23 + iVar13) * 4) =
                           0xff0000ff;
                      bVar22 = 1;
                      bVar4 = false;
                    }
                    lVar26 = lVar26 + 1;
                    bVar19 = (bool)(4 < iVar24 & bVar22);
                  } while (lVar26 < (int)((ulong)((long)pSVar11 - (long)pSVar10) >> 3) * -0x55555555
                          );
                }
              } while ((lVar25 < (int)((ulong)((long)pSVar11 - (long)pSVar10) >> 3) * -0x55555555)
                      && (local_278 = local_278 + 1, lVar14 = lVar25, !bVar19));
            }
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 != width);
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 != height);
    if (!bVar4) {
      if (5 < iVar24) {
        local_1b0._0_8_ =
             ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
        std::ostream::operator<<(poVar1,iVar24 + -5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," error descriptions.",0x14);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
      }
      local_1b0._0_8_ =
           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image verification failed.",0x1a);
      pTVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"Verification","");
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Image Verification","");
      tcu::LogImageSet::LogImageSet(&local_300,&local_370,&local_338);
      tcu::TestLog::startImageSet
                (pTVar6,local_300.m_name._M_dataplus._M_p,local_300.m_description._M_dataplus._M_p);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ErrorMask","");
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Error Mask","");
      local_2a0.order = RGBA;
      local_2a0.type = UNORM_INT8;
      pvVar20 = (void *)CONCAT44(local_318._20_4_,local_318.m_distanceThreshold);
      if (pvVar20 != (void *)0x0) {
        pvVar20 = (void *)CONCAT44(local_318._12_4_,local_318.m_numSamples);
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_270,&local_2a0,
                 (int)local_318.super_Verifier._vptr_Verifier,
                 local_318.super_Verifier._vptr_Verifier._4_4_,1,pvVar20);
      pCVar9 = &local_270;
      tcu::LogImage::LogImage
                (&local_248,&local_2c0,&local_298,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_248,(int)pTVar6,__buf_00,(size_t)pCVar9);
      tcu::TestLog::endImageSet(pTVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
        operator_delete(local_248.m_description._M_dataplus._M_p,
                        local_248.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
        operator_delete(local_248.m_name._M_dataplus._M_p,
                        local_248.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.m_description._M_dataplus._M_p != &local_300.m_description.field_2) {
        operator_delete(local_300.m_description._M_dataplus._M_p,
                        local_300.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300.m_name._M_dataplus._M_p != &local_300.m_name.field_2) {
        operator_delete(local_300.m_name._M_dataplus._M_p,
                        local_300.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      bVar3 = false;
    }
  }
  pvVar20 = (void *)CONCAT44(local_350.m_height,local_350.m_width);
  if (pvVar20 != (void *)0x0) {
    operator_delete(pvVar20,local_350.m_pixels.m_cap - (long)pvVar20);
  }
  tcu::Surface::~Surface((Surface *)&local_318);
  iVar24 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples;
  local_318.super_Verifier._vptr_Verifier = (_func_int **)&PTR_verify_021615e8;
  local_318.m_isStatisticallySignificant = 3 < iVar24;
  fVar27 = 1.0 / ((float)iVar24 * 12.0);
  local_318.m_numSamples = iVar24;
  if (fVar27 < 0.0) {
    fVar27 = sqrtf(fVar27);
  }
  else {
    fVar27 = SQRT(fVar27);
  }
  fVar27 = fVar27 + fVar27;
  local_318.m_distanceThreshold = fVar27;
  tcu::Surface::Surface(&local_350,width,height);
  local_248.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar20 = (void *)local_350.m_pixels.m_cap;
  if ((void *)local_350.m_pixels.m_cap != (void *)0x0) {
    pvVar20 = local_350.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_248,local_350.m_width,
             local_350.m_height,1,pvVar20);
  local_248.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_248.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_248);
  if (iVar24 < 4) {
    bVar4 = false;
  }
  else {
    local_1b0._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying sample position distribution is (nearly) unbiased.",0x3c
              );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    SampleAverageVerifier::logInfo
              (&local_318,
               ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
                super_TestCase.super_TestNode.m_testCtx)->m_log);
    iVar24 = 0;
    if (height < 1) {
      bVar4 = false;
    }
    else {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      bVar4 = false;
      iVar23 = 0;
      do {
        if (0 < width) {
          iVar13 = 0;
          do {
            pSVar10 = (resultBuffers->
                      super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar16 = (int)((long)(resultBuffers->
                                 super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pSVar10 >> 3) *
                     -0x55555555;
            iVar18 = 0;
            iVar15 = 0;
            iVar7 = 0;
            if (0 < (int)uVar16) {
              uVar17 = (ulong)(uVar16 & 0x7fffffff);
              iVar7 = 0;
              iVar15 = 0;
              iVar18 = 0;
              do {
                pAVar12 = &pSVar10->m_pixels;
                uVar16 = *(uint *)((long)pAVar12->m_ptr +
                                  (long)(*(int *)((long)(pAVar12 + -1) + 8) * iVar23 + iVar13) * 4);
                iVar18 = iVar18 + (uVar16 & 0xff);
                iVar15 = iVar15 + (uVar16 >> 0x10 & 0xff);
                iVar7 = iVar7 + (uVar16 >> 8 & 0xff);
                pSVar10 = (pointer)(pAVar12 + 1);
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
            }
            iVar2 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                    m_numTargetSamples;
            uVar16 = iVar15 / iVar2 << 8 | iVar18 / iVar2;
            fVar28 = (float)(uVar16 >> 8 & 0xff) / 255.0 + -0.5;
            fVar29 = -fVar28;
            if (-fVar28 <= fVar28) {
              fVar29 = fVar28;
            }
            if (fVar27 <= fVar29) {
LAB_01444728:
              iVar24 = iVar24 + 1;
              if (iVar24 < 6) {
                local_1b0._0_8_ =
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Pixel (",7);
                std::ostream::operator<<(poVar1,iVar13);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
                std::ostream::operator<<(poVar1,iVar23);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"): Sample distribution is biased.",0x21);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_138);
              }
              *(undefined4 *)
               ((long)local_350.m_pixels.m_ptr + (long)(local_350.m_width * iVar23 + iVar13) * 4) =
                   0xff0000ff;
              bVar4 = true;
            }
            else {
              fVar28 = (float)((uVar16 | iVar7 / iVar2 << 0x10) >> 0x10 & 0xff) / 255.0 + -0.5;
              fVar29 = -fVar28;
              if (-fVar28 <= fVar28) {
                fVar29 = fVar28;
              }
              if (fVar27 <= fVar29) goto LAB_01444728;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 != width);
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 != height);
      if (bVar4) {
        if (5 < iVar24) {
          local_1b0._0_8_ =
               ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
                super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...\n",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
          std::ostream::operator<<(poVar1,iVar24 + -5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," error descriptions.",0x14);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
        }
        local_1b0._0_8_ =
             ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
              super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Image verification failed.",0x1a);
        pTVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"Verification","");
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,"Image Verification","");
        tcu::LogImageSet::LogImageSet(&local_300,&local_370,&local_338);
        tcu::TestLog::startImageSet
                  (pTVar6,local_300.m_name._M_dataplus._M_p,local_300.m_description._M_dataplus._M_p
                  );
        local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"ErrorMask","");
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"Error Mask","");
        local_2a0.order = RGBA;
        local_2a0.type = UNORM_INT8;
        if ((void *)local_350.m_pixels.m_cap != (void *)0x0) {
          local_350.m_pixels.m_cap = (size_t)local_350.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_270,&local_2a0,local_350.m_width,local_350.m_height,1
                   ,(void *)local_350.m_pixels.m_cap);
        pCVar9 = &local_270;
        tcu::LogImage::LogImage
                  (&local_248,&local_2c0,&local_298,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_248,(int)pTVar6,__buf_01,(size_t)pCVar9);
        tcu::TestLog::endImageSet(pTVar6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
          operator_delete(local_248.m_description._M_dataplus._M_p,
                          local_248.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
          operator_delete(local_248.m_name._M_dataplus._M_p,
                          local_248.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300.m_description._M_dataplus._M_p != &local_300.m_description.field_2) {
          operator_delete(local_300.m_description._M_dataplus._M_p,
                          local_300.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300.m_name._M_dataplus._M_p != &local_300.m_name.field_2) {
          operator_delete(local_300.m_name._M_dataplus._M_p,
                          local_300.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
      }
    }
  }
  tcu::Surface::~Surface(&local_350);
  if (bVar3 != false) {
    if (bVar4) {
      this_00 = (QualityWarning *)__cxa_allocate_exception(0x30);
      local_1b0._0_8_ = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,
                 "Bias detected, sample positions are not uniformly distributed within the pixel",""
                );
      MultisampleShaderRenderUtil::QualityWarning::QualityWarning(this_00,(string *)local_1b0);
      __cxa_throw(this_00,&MultisampleShaderRenderUtil::QualityWarning::typeinfo,
                  tcu::Exception::~Exception);
    }
    local_1b0._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Verification ok.",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  return bVar3;
}

Assistant:

bool SamplePosDistributionCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;
	bool		distibutionError	= false;

	// Check sample range, uniqueness, and distribution, log layers
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// verify range
	{
		bool rangeOk = true;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position range" << tcu::TestLog::EndMessage;
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			rangeOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!rangeOk)
		{
			allOk = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Sample position verification failed." << tcu::TestLog::EndMessage;
		}
	}

	// Verify uniqueness
	{
		bool					uniquenessOk	= true;
		tcu::Surface			errorMask		(width, height);
		std::vector<tcu::Vec2>	samplePositions	(resultBuffers.size());
		int						printCount		= 0;
		const int				printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position uniqueness." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool samplePosNotUnique = false;

			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				samplePositions[sampleNdx] = tcu::Vec2((float)color.getGreen() / 255.0f, (float)color.getBlue() / 255.0f);
			}

			// Just check there are no two samples with same positions
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same position."
							<< tcu::TestLog::EndMessage;
					}

					samplePosNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	// check distribution
	{
		const SampleAverageVerifier verifier		(m_numTargetSamples);
		tcu::Surface				errorMask		(width, height);
		int							printCount		= 0;
		const int					printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// don't bother with small sample counts
		if (verifier.m_isStatisticallySignificant)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position distribution is (nearly) unbiased." << tcu::TestLog::EndMessage;
			verifier.logInfo(m_testCtx.getLog());

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				tcu::IVec3 colorSum(0, 0, 0);

				// color average

				for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
				{
					const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
					colorSum.x() += color.getRed();
					colorSum.y() += color.getBlue();
					colorSum.z() += color.getGreen();
				}

				colorSum.x() /= m_numTargetSamples;
				colorSum.y() /= m_numTargetSamples;
				colorSum.z() /= m_numTargetSamples;

				// verify average sample position

				if (!verifier.verify(tcu::RGBA(colorSum.x(), colorSum.y(), colorSum.z(), 0), tcu::IVec2(x, y)))
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Sample distribution is biased."
							<< tcu::TestLog::EndMessage;
					}

					distibutionError = true;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}

			// sub-verification result
			if (distibutionError)
			{
				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;

				m_testCtx.getLog()
					<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
					<< tcu::TestLog::ImageSet("Verification", "Image Verification")
					<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
					<< tcu::TestLog::EndImageSet;
			}
		}
	}

	// results
	if (!allOk)
		return false;
	else if (distibutionError)
		throw MultisampleShaderRenderUtil::QualityWarning("Bias detected, sample positions are not uniformly distributed within the pixel");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verification ok." << tcu::TestLog::EndMessage;
		return true;
	}
}